

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O1

Vector2f __thiscall
sf::RenderTarget::mapPixelToCoords(RenderTarget *this,Vector2i *point,View *view)

{
  Transform *this_00;
  float fVar1;
  float fVar2;
  Vector2f VVar3;
  IntRect IVar4;
  Vector2f normalized;
  Vector2f local_20;
  
  local_20.x = 0.0;
  local_20.y = 0.0;
  IVar4 = getViewport(this,view);
  fVar1 = (float)(point->x - IVar4.left);
  fVar2 = (float)(point->y - IVar4.top);
  local_20.y = 1.0 - (fVar2 + fVar2) / (float)IVar4.height;
  local_20.x = (fVar1 + fVar1) / (float)IVar4.width + -1.0;
  this_00 = View::getInverseTransform(view);
  VVar3 = Transform::transformPoint(this_00,&local_20);
  return VVar3;
}

Assistant:

Vector2f RenderTarget::mapPixelToCoords(const Vector2i& point, const View& view) const
{
    // First, convert from viewport coordinates to homogeneous coordinates
    Vector2f normalized;
    IntRect viewport = getViewport(view);
    normalized.x = -1.f + 2.f * (point.x - viewport.left) / viewport.width;
    normalized.y =  1.f - 2.f * (point.y - viewport.top)  / viewport.height;

    // Then transform by the inverse of the view matrix
    return view.getInverseTransform().transformPoint(normalized);
}